

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessage<char_const*,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,char *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  _Alloc_hider params_1_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  params_1_00._M_p = (pointer)0x0;
  ::std::__cxx11::string::string(local_40,(string *)params);
  ::std::__cxx11::string::string((string *)&local_60,(string *)params_1);
  ConstructMessageRecursive<char_const*,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,(string *)&stack0xffffffffffffff88,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(char *)local_40,&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params_1_00._M_p);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string(local_40);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &stack0xffffffffffffff88);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}